

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O1

void __thiscall
baryonyx::to_log<double>(baryonyx *this,FILE *os,uint indent,string_view fmt,double *args)

{
  undefined4 in_register_00000014;
  format_args args_00;
  format_args args_01;
  string_view format_str;
  string_view format_str_00;
  char *local_48 [2];
  ulong local_38;
  
  format_str_00.size_._4_4_ = in_register_00000014;
  format_str_00.size_._0_4_ = indent;
  local_38 = (ulong)os & 0xffffffff;
  local_48[0] = "";
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_48;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x2c;
  format_str.size_ = 5;
  format_str.data_ = "{:{}}";
  ::fmt::v7::vprint((FILE *)this,format_str,args_00);
  local_48[0] = *(char **)fmt._M_str;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_48;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 10;
  format_str_00.data_ = (char *)fmt._M_len;
  ::fmt::v7::vprint((FILE *)this,format_str_00,args_01);
  return;
}

Assistant:

void
to_log([[maybe_unused]] std::FILE* os,
       [[maybe_unused]] unsigned indent,
       [[maybe_unused]] const std::string_view fmt,
       [[maybe_unused]] const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
#ifdef BARYONYX_ENABLE_DEBUG
    fmt::print(os, "{:{}}", "", indent);
    fmt::print(os, fmt, args...);
#endif
#endif
}